

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O1

REF_STATUS ref_node_stable_compact(REF_NODE ref_node,REF_INT **o2n_ptr,REF_INT **n2o_ptr)

{
  REF_GLOB *pRVar1;
  bool bVar2;
  REF_STATUS RVar3;
  REF_INT *pRVar4;
  REF_INT *pRVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  undefined8 uVar9;
  long lVar10;
  char *pcVar11;
  
  if ((long)ref_node->max < 0) {
    bVar2 = false;
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x34d,
           "ref_node_stable_compact","malloc *o2n_ptr of REF_INT negative");
    RVar3 = 1;
  }
  else {
    pRVar4 = (REF_INT *)malloc((long)ref_node->max << 2);
    *o2n_ptr = pRVar4;
    if (pRVar4 == (REF_INT *)0x0) {
      bVar2 = false;
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x34d,
             "ref_node_stable_compact","malloc *o2n_ptr of REF_INT NULL");
      RVar3 = 2;
    }
    else {
      bVar2 = true;
      if (0 < ref_node->max) {
        uVar8 = 1;
        if (1 < ref_node->max) {
          uVar8 = (ulong)(uint)ref_node->max;
        }
        pRVar4 = (REF_INT *)memset(pRVar4,0xff,uVar8 << 2);
      }
      RVar3 = (REF_STATUS)pRVar4;
    }
  }
  if (!bVar2) {
    return RVar3;
  }
  if ((long)ref_node->n < 0) {
    pcVar11 = "malloc *n2o_ptr of REF_INT negative";
    uVar9 = 0x34f;
  }
  else {
    pRVar4 = *o2n_ptr;
    pRVar5 = (REF_INT *)malloc((long)ref_node->n << 2);
    *n2o_ptr = pRVar5;
    if (pRVar5 == (REF_INT *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x34f,
             "ref_node_stable_compact","malloc *n2o_ptr of REF_INT NULL");
      return 2;
    }
    uVar7 = ref_node->max;
    if ((int)uVar7 < 1) {
      iVar6 = 0;
    }
    else {
      pRVar1 = ref_node->global;
      lVar10 = 0;
      iVar6 = 0;
      do {
        if (-1 < pRVar1[lVar10]) {
          pRVar4[lVar10] = iVar6;
          iVar6 = iVar6 + 1;
        }
        lVar10 = lVar10 + 1;
        uVar7 = ref_node->max;
      } while (lVar10 < (int)uVar7);
    }
    if (iVar6 == ref_node->n) {
      if (0 < (int)uVar7) {
        pRVar1 = ref_node->global;
        uVar8 = 0;
        do {
          if (-1 < pRVar1[uVar8]) {
            pRVar5[pRVar4[uVar8]] = (REF_INT)uVar8;
          }
          uVar8 = uVar8 + 1;
        } while (uVar7 != uVar8);
      }
      return 0;
    }
    pcVar11 = "nnode miscount";
    uVar9 = 0x359;
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar9,
         "ref_node_stable_compact",pcVar11);
  return 1;
}

Assistant:

REF_FCN REF_STATUS ref_node_stable_compact(REF_NODE ref_node, REF_INT **o2n_ptr,
                                           REF_INT **n2o_ptr) {
  REF_INT node;
  REF_INT nnode;
  REF_INT *o2n, *n2o;

  ref_malloc_init(*o2n_ptr, ref_node_max(ref_node), REF_INT, REF_EMPTY);
  o2n = *o2n_ptr;
  ref_malloc(*n2o_ptr, ref_node_n(ref_node), REF_INT);
  n2o = *n2o_ptr;

  nnode = 0;

  each_ref_node_valid_node(ref_node, node) {
    o2n[node] = nnode;
    nnode++;
  }

  RES(nnode, ref_node_n(ref_node), "nnode miscount");

  each_ref_node_valid_node(ref_node, node) n2o[o2n[node]] = node;

  return REF_SUCCESS;
}